

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_ArraySpeciesCreate(JSContext *ctx,JSValue obj,JSValue len_val)

{
  int iVar1;
  BOOL BVar2;
  JSValueUnion JVar3;
  JSContext *pJVar4;
  ulong uVar5;
  JSValueUnion JVar6;
  JSValue JVar7;
  JSValue JVar8;
  JSValue JVar9;
  JSValue len_val_local;
  
  len_val_local.tag = len_val.tag;
  len_val_local.u = len_val.u;
  iVar1 = JS_IsArray(ctx,obj);
  if (iVar1 < 0) {
LAB_00155cb8:
    JVar7 = (JSValue)(ZEXT816(6) << 0x40);
    uVar5 = 0;
    goto LAB_00155cbe;
  }
  if (iVar1 == 0) {
LAB_00155bfa:
    JVar7 = js_array_constructor(ctx,(JSValue)(ZEXT816(3) << 0x40),1,&len_val_local);
    JVar3 = JVar7.u;
  }
  else {
    JVar7 = JS_GetPropertyInternal(ctx,obj,0x3c,obj,0);
    uVar5 = (ulong)JVar7.u.ptr & 0xffffffff00000000;
    iVar1 = (int)JVar7.tag;
    if (iVar1 == 6) goto LAB_00155cbe;
    if ((iVar1 == -1) && ((*(byte *)((long)JVar7.u.ptr + 5) & 0x10) != 0)) {
      pJVar4 = JS_GetFunctionRealm(ctx,JVar7);
      if (pJVar4 == (JSContext *)0x0) {
        JS_FreeValue(ctx,JVar7);
        goto LAB_00155cb8;
      }
      if ((pJVar4 != ctx) && (BVar2 = js_same_value(ctx,JVar7,pJVar4->array_ctor), BVar2 != 0)) {
        JS_FreeValue(ctx,JVar7);
        goto LAB_00155bfa;
      }
    }
    JVar8 = JVar7;
    if (iVar1 == -1) {
      JVar8 = JS_GetPropertyInternal(ctx,JVar7,0xcf,JVar7,0);
      JS_FreeValue(ctx,JVar7);
      if ((int)JVar8.tag == 2) goto LAB_00155bfa;
      uVar5 = (ulong)JVar8.u.ptr & 0xffffffff00000000;
      JVar7 = JVar8;
      if ((int)JVar8.tag == 6) goto LAB_00155cbe;
    }
    if ((int)JVar8.tag == 3) goto LAB_00155bfa;
    JVar6.ptr = (void *)(uVar5 | (ulong)JVar8.u.ptr & 0xffffffff);
    JVar7.tag = JVar8.tag;
    JVar7.u.ptr = JVar6.ptr;
    JVar7 = JS_CallConstructor(ctx,JVar7,1,&len_val_local);
    JVar3 = JVar7.u;
    JVar8.tag = JVar8.tag;
    JVar8.u.ptr = JVar6.ptr;
    JS_FreeValue(ctx,JVar8);
  }
  uVar5 = (ulong)JVar3.ptr & 0xffffffff00000000;
LAB_00155cbe:
  JVar9.u.ptr = (void *)((ulong)JVar7.u.ptr & 0xffffffff | uVar5);
  JVar9.tag = JVar7.tag;
  return JVar9;
}

Assistant:

static JSValue JS_ArraySpeciesCreate(JSContext *ctx, JSValueConst obj,
                                     JSValueConst len_val)
{
    JSValue ctor, ret, species;
    int res;
    JSContext *realm;
    
    res = JS_IsArray(ctx, obj);
    if (res < 0)
        return JS_EXCEPTION;
    if (!res)
        return js_array_constructor(ctx, JS_UNDEFINED, 1, &len_val);
    ctor = JS_GetProperty(ctx, obj, JS_ATOM_constructor);
    if (JS_IsException(ctor))
        return ctor;
    if (JS_IsConstructor(ctx, ctor)) {
        /* legacy web compatibility */
        realm = JS_GetFunctionRealm(ctx, ctor);
        if (!realm) {
            JS_FreeValue(ctx, ctor);
            return JS_EXCEPTION;
        }
        if (realm != ctx &&
            js_same_value(ctx, ctor, realm->array_ctor)) {
            JS_FreeValue(ctx, ctor);
            ctor = JS_UNDEFINED;
        }
    }
    if (JS_IsObject(ctor)) {
        species = JS_GetProperty(ctx, ctor, JS_ATOM_Symbol_species);
        JS_FreeValue(ctx, ctor);
        if (JS_IsException(species))
            return species;
        ctor = species;
        if (JS_IsNull(ctor))
            ctor = JS_UNDEFINED;
    }
    if (JS_IsUndefined(ctor)) {
        return js_array_constructor(ctx, JS_UNDEFINED, 1, &len_val);
    } else {
        ret = JS_CallConstructor(ctx, ctor, 1, &len_val);
        JS_FreeValue(ctx, ctor);
        return ret;
    }
}